

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndGroup(void)

{
  ImVector<ImGuiGroupData> *pIVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiGroupData *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiID IVar6;
  long lVar7;
  ImGuiContext *g;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  ImRect local_68;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  ImVec2 local_28;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  pIVar4 = (pIVar3->DC).GroupStack.Data;
  lVar7 = (long)(pIVar3->DC).GroupStack.Size;
  local_68.Min = pIVar4[lVar7 + -1].BackupCursorPos;
  IVar2 = (pIVar3->DC).CursorMaxPos;
  fVar10 = IVar2.x;
  fVar11 = IVar2.y;
  local_38 = local_68.Min.y;
  uVar8 = -(uint)(fVar10 <= local_68.Min.x);
  uVar9 = -(uint)(fVar11 <= local_38);
  uStack_40 = 0;
  local_68.Max = (ImVec2)(CONCAT44(~uVar9 & (uint)fVar11,~uVar8 & (uint)fVar10) |
                         CONCAT44((uint)local_38 & uVar9,(uint)local_68.Min.x & uVar8));
  uStack_50 = 0;
  (pIVar3->DC).CursorPos = local_68.Min;
  local_58 = local_68.Max;
  local_48 = local_68.Min;
  fStack_34 = local_38;
  fStack_30 = local_38;
  fStack_2c = local_38;
  IVar2 = ImMax(&pIVar4[lVar7 + -1].BackupCursorMaxPos,&(pIVar3->DC).CursorMaxPos);
  (pIVar3->DC).CursorMaxPos = IVar2;
  (pIVar3->DC).Indent.x = pIVar4[lVar7 + -1].BackupIndent.x;
  (pIVar3->DC).GroupOffset.x = pIVar4[lVar7 + -1].BackupGroupOffset.x;
  (pIVar3->DC).CurrentLineSize = pIVar4[lVar7 + -1].BackupCurrentLineSize;
  fVar10 = pIVar4[lVar7 + -1].BackupCurrentLineTextBaseOffset;
  (pIVar3->DC).CurrentLineTextBaseOffset = fVar10;
  (pIVar3->DC).LogLinePosY = local_38 + -9999.0;
  if (pIVar4[lVar7 + -1].AdvanceCursor == true) {
    fVar11 = (pIVar3->DC).PrevLineTextBaseOffset;
    uVar8 = -(uint)(fVar10 <= fVar11);
    (pIVar3->DC).CurrentLineTextBaseOffset = (float)(~uVar8 & (uint)fVar10 | (uint)fVar11 & uVar8);
    local_28.x = local_58.x - local_48.x;
    local_28.y = local_58.y - local_48.y;
    ItemSize(&local_28,fVar10);
    ItemAdd(&local_68,0,(ImRect *)0x0);
  }
  IVar6 = pIVar5->ActiveId;
  if (((pIVar4[lVar7 + -1].BackupActiveIdIsAlive == IVar6) || (IVar6 == 0)) ||
     (pIVar5->ActiveIdIsAlive != IVar6)) {
    if ((pIVar4[lVar7 + -1].BackupActiveIdPreviousFrameIsAlive != false) ||
       (pIVar5->ActiveIdPreviousFrameIsAlive != true)) goto LAB_00125482;
    IVar6 = pIVar5->ActiveIdPreviousFrame;
  }
  (pIVar3->DC).LastItemId = IVar6;
LAB_00125482:
  (pIVar3->DC).LastItemRect.Min = local_68.Min;
  (pIVar3->DC).LastItemRect.Max = local_68.Max;
  pIVar1 = &(pIVar3->DC).GroupStack;
  pIVar1->Size = pIVar1->Size + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(!window->DC.GroupStack.empty());    // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, window->DC.CursorMaxPos);
    group_bb.Max = ImMax(group_bb.Min, group_bb.Max);

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrentLineSize = group_data.BackupCurrentLineSize;
    window->DC.CurrentLineTextBaseOffset = group_data.BackupCurrentLineTextBaseOffset;
    window->DC.LogLinePosY = window->DC.CursorPos.y - 9999.0f; // To enforce Log carriage return

    if (group_data.AdvanceCursor)
    {
        window->DC.CurrentLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrentLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
        ItemSize(group_bb.GetSize(), group_data.BackupCurrentLineTextBaseOffset);
        ItemAdd(group_bb, 0);
    }

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // (and if you grep for LastItemId you'll notice it is only used in that context.
    if ((group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId) // && g.ActiveIdWindow->RootWindow == window->RootWindow)
        window->DC.LastItemId = g.ActiveId;
    else if (!group_data.BackupActiveIdPreviousFrameIsAlive && g.ActiveIdPreviousFrameIsAlive) // && g.ActiveIdPreviousFrameWindow->RootWindow == window->RootWindow)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    window->DC.GroupStack.pop_back();

    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}